

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::CompiledModule::CompiledModule
          (CompiledModule *this,Impl *compiler,Module *parserModule)

{
  Orphanage OVar1;
  
  this->compiler = compiler;
  this->parserModule = parserModule;
  MallocMessageBuilder::MallocMessageBuilder(&this->contentArena,0x400,GROW_HEURISTICALLY);
  OVar1 = MessageBuilder::getOrphanage(&(this->contentArena).super_MessageBuilder);
  (*(parserModule->super_ErrorReporter)._vptr_ErrorReporter[3])
            (&this->content,parserModule,OVar1.arena,OVar1.capTable);
  Node::Node(&this->rootNode,this);
  return;
}

Assistant:

Compiler::CompiledModule::CompiledModule(Compiler::Impl& compiler, Module& parserModule)
    : compiler(compiler), parserModule(parserModule),
      content(parserModule.loadContent(contentArena.getOrphanage())),
      rootNode(*this) {}